

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O0

int Am_Horizontal_Layout_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int primary_spacing;
  int iVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  int local_1c8;
  int local_1c4;
  int local_194;
  int local_18c;
  int height;
  int width;
  Am_Object item;
  int local_80;
  int rank;
  int line_height;
  int line_rank;
  int indent;
  Am_Alignment v_align;
  Am_Alignment h_align;
  int v_spacing;
  int h_spacing;
  int top;
  int left;
  int left_offset;
  int local_50;
  int local_4c;
  int max_size;
  int max_rank;
  int local_40;
  int local_3c;
  int fixed_height;
  int fixed_width;
  Am_Object component;
  undefined1 local_20 [8];
  Am_Value_List components;
  Am_Object *self_local;
  
  components.item = (Am_List_Item *)self;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x82,0);
  Am_Value_List::operator=((Am_Value_List *)local_20,pAVar4);
  Am_Object::Am_Object((Am_Object *)&fixed_height);
  Am_Value_List::Start((Am_Value_List *)local_20);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_20), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar4 = Am_Value_List::Get((Am_Value_List *)local_20);
    Am_Object::operator=((Am_Object *)&fixed_height,pAVar4);
    pAVar4 = Am_Object::Get((Am_Object *)&fixed_height,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      Am_Value_List::Delete((Am_Value_List *)local_20,true);
    }
    Am_Value_List::Next((Am_Value_List *)local_20);
  }
  Am_Object::Am_Object((Am_Object *)&max_size,(Am_Object *)components.item);
  get_fixed_sizes((Am_Object *)&max_size,(Am_Value_List *)local_20,&local_3c,&local_40);
  Am_Object::~Am_Object((Am_Object *)&max_size);
  Am_Object::Am_Object((Am_Object *)&left,(Am_Object *)components.item);
  get_max_rank_and_size((Am_Object *)&left,&local_4c,&local_50);
  Am_Object::~Am_Object((Am_Object *)&left);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x9e,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x9f,0);
  v_spacing = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x95,0);
  primary_spacing = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x96,0);
  v_align.value = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x97,0);
  Am_Alignment::Am_Alignment((Am_Alignment *)&indent,pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x98,0);
  Am_Alignment::Am_Alignment((Am_Alignment *)&line_rank,pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x9b,0);
  line_height = Am_Value::operator_cast_to_int(pAVar4);
  Am_Value_List::Start((Am_Value_List *)local_20);
  h_spacing = iVar2;
  do {
    bVar1 = Am_Value_List::Last((Am_Value_List *)local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Am_Object::~Am_Object((Am_Object *)&fixed_height);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
      return 0;
    }
    find_line_size_and_rank
              ((Am_Value_List *)local_20,h_spacing,local_3c,0x66,primary_spacing,0x67,local_4c,
               local_50,&rank,&local_80);
    item.data._4_4_ = 0;
    while (item.data._4_4_ < rank) {
      Am_Object::Am_Object((Am_Object *)&height);
      pAVar4 = Am_Value_List::Get((Am_Value_List *)local_20);
      Am_Object::operator=((Am_Object *)&height,pAVar4);
      pAVar4 = Am_Object::Get((Am_Object *)&height,0x69,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
      if (bVar1) {
        pAVar4 = Am_Object::Get((Am_Object *)&height,0x66,0);
        local_1c4 = Am_Value::operator_cast_to_int(pAVar4);
        pAVar4 = Am_Object::Get((Am_Object *)&height,0x67,0);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        if (local_3c == 0) {
          Am_Object::Set((Am_Object *)&height,100,h_spacing,0);
        }
        else if (indent == 0) {
          Am_Object::Set((Am_Object *)&height,100,h_spacing + (local_3c - local_1c4) / 2,0);
        }
        else if (indent == 3) {
          Am_Object::Set((Am_Object *)&height,100,h_spacing,0);
        }
        else {
          if (indent != 4) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
            poVar5 = std::operator<<(poVar5,"Bad alignment value ");
            poVar5 = operator<<(poVar5,(Am_Alignment *)&indent);
            poVar5 = std::operator<<(poVar5," in Am_H_ALIGN of ");
            poVar5 = operator<<(poVar5,(Am_Object *)components.item);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            Am_Error();
          }
          Am_Object::Set((Am_Object *)&height,100,(h_spacing + local_3c) - local_1c4,0);
        }
        if (line_rank == 0) {
          if (local_40 == 0) {
            local_194 = local_80;
          }
          else {
            local_194 = local_40;
          }
          Am_Object::Set((Am_Object *)&height,0x65,v_spacing + (local_194 - iVar3) / 2,0);
        }
        else if (line_rank == 1) {
          Am_Object::Set((Am_Object *)&height,0x65,v_spacing,0);
        }
        else {
          if (line_rank != 2) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
            poVar5 = std::operator<<(poVar5,"Bad alignment value ");
            poVar5 = operator<<(poVar5,(Am_Alignment *)&line_rank);
            poVar5 = std::operator<<(poVar5," in Am_V_ALIGN of ");
            poVar5 = operator<<(poVar5,(Am_Object *)components.item);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            Am_Error();
          }
          if (local_40 == 0) {
            local_18c = local_80;
          }
          else {
            local_18c = local_40;
          }
          Am_Object::Set((Am_Object *)&height,0x65,(v_spacing + local_18c) - iVar3,0);
        }
        if (local_3c != 0) {
          local_1c4 = local_3c;
        }
        h_spacing = local_1c4 + primary_spacing + h_spacing;
        item.data._4_4_ = item.data._4_4_ + 1;
      }
      Am_Value_List::Next((Am_Value_List *)local_20);
      Am_Object::~Am_Object((Am_Object *)&height);
    }
    if (local_40 == 0) {
      local_1c8 = local_80;
    }
    else {
      local_1c8 = local_40;
    }
    v_spacing = local_1c8 + v_align.value + v_spacing;
    h_spacing = iVar2 + line_height;
  } while( true );
}

Assistant:

Am_Define_Formula(int, Am_Horizontal_Layout)
{
  Am_Value_List components;
  components = self.Get(Am_GRAPHICAL_PARTS);
  Am_Object component;
  for (components.Start(); !components.Last(); components.Next()) {
    component = components.Get();
    if (!(bool)component.Get(Am_VISIBLE))
      components.Delete();
  }
  int fixed_width, fixed_height;
  get_fixed_sizes(self, components, fixed_width, fixed_height);
  int max_rank, max_size;
  get_max_rank_and_size(self, max_rank, max_size);
  int left_offset = self.Get(Am_LEFT_OFFSET);
  int left = left_offset;
  int top = self.Get(Am_TOP_OFFSET);
  int h_spacing = self.Get(Am_H_SPACING);
  int v_spacing = self.Get(Am_V_SPACING);
  Am_Alignment h_align = self.Get(Am_H_ALIGN);
  Am_Alignment v_align = self.Get(Am_V_ALIGN);
  int indent = self.Get(Am_INDENT);
  components.Start();
  while (!components.Last()) {
    int line_rank;
    int line_height;
    find_line_size_and_rank(components, left, fixed_width, Am_WIDTH, h_spacing,
                            Am_HEIGHT, max_rank, max_size, line_rank,
                            line_height);
    int rank = 0;
    while (rank < line_rank) {
      Am_Object item;
      item = components.Get();
      if ((bool)item.Get(Am_VISIBLE)) {
        int width = item.Get(Am_WIDTH);
        int height = item.Get(Am_HEIGHT);
        if (fixed_width) {
          switch (h_align.value) {
          case Am_LEFT_ALIGN_val:
            item.Set(Am_LEFT, left);
            break;
          case Am_RIGHT_ALIGN_val:
            item.Set(Am_LEFT, left + fixed_width - width);
            break;
          case Am_CENTER_ALIGN_val:
            item.Set(Am_LEFT, left + (fixed_width - width) / 2);
            break;
          default:
            Am_ERRORO("Bad alignment value " << h_align << " in Am_H_ALIGN of "
                                             << self,
                      self, Am_H_ALIGN);
          }
        } else
          item.Set(Am_LEFT, left);
        switch (v_align.value) {
        case Am_TOP_ALIGN_val:
          item.Set(Am_TOP, top);
          break;
        case Am_BOTTOM_ALIGN_val:
          item.Set(Am_TOP,
                   top + (fixed_height ? fixed_height : line_height) - height);
          break;
        case Am_CENTER_ALIGN_val:
          item.Set(
              Am_TOP,
              top + ((fixed_height ? fixed_height : line_height) - height) / 2);
          break;
        default:
          Am_ERRORO("Bad alignment value " << v_align << " in Am_V_ALIGN of "
                                           << self,
                    self, Am_V_ALIGN);
        }
        left += (fixed_width ? fixed_width : width) + h_spacing;
        ++rank;
      }
      components.Next();
    }
    top += (fixed_height ? fixed_height : line_height) + v_spacing;
    left = left_offset + indent;
  }
  return 0;
}